

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttcpal.c
# Opt level: O0

void tt_face_free_cpal(TT_Face face)

{
  FT_Memory memory_00;
  void *P;
  Cpal *cpal;
  FT_Memory memory;
  FT_Stream stream;
  TT_Face face_local;
  
  memory_00 = (face->root).memory;
  P = face->cpal;
  if (P != (void *)0x0) {
    FT_Stream_ReleaseFrame((face->root).stream,(FT_Byte **)((long)P + 0x18));
    ft_mem_free(memory_00,P);
  }
  return;
}

Assistant:

FT_LOCAL_DEF( void )
  tt_face_free_cpal( TT_Face  face )
  {
    FT_Stream  stream = face->root.stream;
    FT_Memory  memory = face->root.memory;

    Cpal*  cpal = (Cpal*)face->cpal;


    if ( cpal )
    {
      FT_FRAME_RELEASE( cpal->table );
      FT_FREE( cpal );
    }
  }